

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintFieldName_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,Message *message,
          Reflection *reflection,FieldDescriptor *field)

{
  Type TVar1;
  Descriptor *pDVar2;
  long *plVar3;
  Descriptor *pDVar4;
  AlphaNum *c;
  AlphaNum local_b0;
  AlphaNum local_80;
  char *local_50;
  undefined8 local_48;
  
  if (field[0x50] == (FieldDescriptor)0x1) {
    c = (AlphaNum *)field;
    if ((((*(char *)(*(long *)(*(long *)(field + 0x58) + 0x20) + 0x68) == '\x01') &&
         (TVar1 = FieldDescriptor::type(field), TVar1 == TYPE_MESSAGE)) &&
        (*(int *)(field + 0x4c) == 1)) &&
       (pDVar4 = *(Descriptor **)(field + 0x68), pDVar2 = FieldDescriptor::message_type(field),
       pDVar4 == pDVar2)) {
      local_50 = "[";
      local_48 = 1;
      pDVar4 = FieldDescriptor::message_type(field);
      local_80.piece_data_ = (char *)**(undefined8 **)(pDVar4 + 8);
      local_80.piece_size_ = (*(undefined8 **)(pDVar4 + 8))[1];
    }
    else {
      local_50 = "[";
      local_48 = 1;
      local_80.piece_data_ = (char *)**(undefined8 **)(field + 8);
      local_80.piece_size_ = (*(undefined8 **)(field + 8))[1];
    }
    local_b0.piece_size_ = 1;
    local_b0.piece_data_ = "]";
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_50,&local_80,&local_b0,c);
    return __return_storage_ptr__;
  }
  TVar1 = FieldDescriptor::type(field);
  if (TVar1 == TYPE_GROUP) {
    pDVar4 = FieldDescriptor::message_type(field);
    plVar3 = *(long **)pDVar4;
  }
  else {
    plVar3 = *(long **)field;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*plVar3,plVar3[1] + *plVar3);
  return __return_storage_ptr__;
}

Assistant:

string TextFormat::FieldValuePrinter::PrintFieldName(
    const Message& message,
    const Reflection* reflection,
    const FieldDescriptor* field) const {
  if (field->is_extension()) {
    // We special-case MessageSet elements for compatibility with proto1.
    if (field->containing_type()->options().message_set_wire_format()
        && field->type() == FieldDescriptor::TYPE_MESSAGE
        && field->is_optional()
        && field->extension_scope() == field->message_type()) {
      return StrCat("[", field->message_type()->full_name(), "]");
    } else {
      return StrCat("[", field->full_name(), "]");
    }
  } else if (field->type() == FieldDescriptor::TYPE_GROUP) {
    // Groups must be serialized with their original capitalization.
    return field->message_type()->name();
  } else {
    return field->name();
  }
}